

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::X
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZVec<double> *coordinate,
          TPZVec<double> *result)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  TPZGeoNode *pTVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  TPZFNMatrix<54,_double> cornerco;
  TPZFMatrix<double> local_278;
  double local_1e8 [55];
  
  local_278.fElem = local_1e8;
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01882128;
  local_278.fSize = 0x36;
  lVar8 = 0;
  local_278.fGiven = local_278.fElem;
  TPZVec<int>::TPZVec(&local_278.fPivot.super_TPZVec<int>,0);
  local_278.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_278.fPivot.super_TPZVec<int>.fStore = local_278.fPivot.fExtAlloc;
  local_278.fPivot.super_TPZVec<int>.fNElements = 0;
  local_278.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_278.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_278.fWork.fStore = (double *)0x0;
  local_278.fWork.fNElements = 0;
  local_278.fWork.fNAlloc = 0;
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01881e38;
  bVar3 = true;
  do {
    pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(((this->super_TPZGeoEl).fMesh)->fNodeVec).
                         super_TPZChunkVector<TPZGeoNode,_10>,
                        (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[lVar8]);
    lVar6 = 0;
    do {
      if ((local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
         (local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_278.fElem[local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar6] =
           pTVar4->fCoord[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar8 = 1;
    bVar2 = !bVar3;
    bVar3 = false;
    if (bVar2) {
      uVar5 = (uint)local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
      if (0 < (int)uVar5) {
        dVar1 = *coordinate->fStore;
        uVar7 = 0;
        do {
          (*local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_278,uVar7,0);
          (*local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_278,uVar7,1);
          result->fStore[uVar7] =
               extraout_XMM0_Qa * (1.0 - dVar1) * 0.5 + extraout_XMM0_Qa_00 * (dVar1 + 1.0) * 0.5;
          uVar7 = uVar7 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar7);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_278,&PTR_PTR_018820f0);
      return;
    }
  } while( true );
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<REAL> &coordinate,TPZVec<REAL> &result) const {
#ifdef PZDEBUG
    if(result.size() != 3) DebugStop();
#endif
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
	fGeo.X(cornerco,coordinate,result);
}